

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS
ref_gather_scalar_edge_tec
          (REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char **scalar_names,char *filename)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT cell_id;
  REF_INT max_id;
  REF_INT min_id;
  REF_LONG ncell;
  REF_GLOB *l2c;
  REF_GLOB nnode;
  FILE *pFStack_58;
  REF_INT i;
  FILE *file;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  char *filename_local;
  char **scalar_names_local;
  REF_DBL *scalar_local;
  REF_GRID pRStack_18;
  REF_INT ldim_local;
  REF_GRID ref_grid_local;
  
  ref_node = (REF_NODE)ref_grid->mpi;
  ref_cell = (REF_CELL)ref_grid->node;
  pFStack_58 = (FILE *)0x0;
  ref_mpi = (REF_MPI)filename;
  filename_local = (char *)scalar_names;
  scalar_names_local = (char **)scalar;
  scalar_local._4_4_ = ldim;
  pRStack_18 = ref_grid;
  if (ref_grid->mpi->id == 0) {
    pFStack_58 = fopen(filename,"w");
    if (pFStack_58 == (FILE *)0x0) {
      printf("unable to open %s\n",ref_mpi);
    }
    if (pFStack_58 == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xda1,"ref_gather_scalar_edge_tec","unable to open file");
      return 2;
    }
    fprintf(pFStack_58,"title=\"tecplot refine gather\"\n");
    fprintf(pFStack_58,"variables = \"x\" \"y\" \"z\"");
    if (filename_local == (char *)0x0) {
      for (nnode._4_4_ = 0; nnode._4_4_ < scalar_local._4_4_; nnode._4_4_ = nnode._4_4_ + 1) {
        fprintf(pFStack_58," \"V%d\"",(ulong)(nnode._4_4_ + 1));
      }
    }
    else {
      for (nnode._4_4_ = 0; nnode._4_4_ < scalar_local._4_4_; nnode._4_4_ = nnode._4_4_ + 1) {
        fprintf(pFStack_58," \"%s\"",*(undefined8 *)(filename_local + (long)nnode._4_4_ * 8));
      }
    }
    fprintf(pFStack_58,"\n");
  }
  uVar1 = ref_node_synchronize_globals((REF_NODE)ref_cell);
  if (uVar1 == 0) {
    file = (FILE *)pRStack_18->cell[0];
    uVar1 = ref_cell_id_range((REF_CELL)file,(REF_MPI)ref_node,&cell_id,&ref_private_macro_code_rss)
    ;
    if (uVar1 == 0) {
      for (ref_private_macro_code_rss_1 = cell_id;
          ref_private_macro_code_rss_1 <= ref_private_macro_code_rss;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        uVar1 = ref_grid_compact_cell_id_nodes
                          (pRStack_18,(REF_CELL)file,ref_private_macro_code_rss_1,(REF_GLOB *)&l2c,
                           (REF_LONG *)&max_id,(REF_GLOB **)&ncell);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xdb4,"ref_gather_scalar_edge_tec",(ulong)uVar1,"l2c");
          return uVar1;
        }
        if ((0 < (long)l2c) && (0 < _max_id)) {
          if (pRStack_18->mpi->id == 0) {
            fprintf(pFStack_58,
                    "zone t=\"edg%d\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",
                    (ulong)(uint)ref_private_macro_code_rss_1,l2c,_max_id,"point","felineseg");
          }
          uVar1 = ref_gather_node_tec_part
                            ((REF_NODE)ref_cell,(REF_GLOB)l2c,(REF_GLOB *)ncell,scalar_local._4_4_,
                             (REF_DBL *)scalar_names_local,(FILE *)pFStack_58);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xdbe,"ref_gather_scalar_edge_tec",(ulong)uVar1,"nodes");
            return uVar1;
          }
          uVar1 = ref_gather_cell_id_tec
                            ((REF_NODE)ref_cell,(REF_CELL)file,ref_private_macro_code_rss_1,_max_id,
                             (REF_GLOB *)ncell,0,(FILE *)pFStack_58);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xdc1,"ref_gather_scalar_edge_tec",(ulong)uVar1,"t");
            return uVar1;
          }
        }
        if (ncell != 0) {
          free((void *)ncell);
        }
      }
      if (pRStack_18->mpi->id == 0) {
        fclose(pFStack_58);
      }
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xdaf,"ref_gather_scalar_edge_tec",(ulong)uVar1,"range");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xdac,
           "ref_gather_scalar_edge_tec",(ulong)uVar1,"sync");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_scalar_edge_tec(REF_GRID ref_grid,
                                                     REF_INT ldim,
                                                     REF_DBL *scalar,
                                                     const char **scalar_names,
                                                     const char *filename) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  FILE *file;
  REF_INT i;
  REF_GLOB nnode, *l2c;
  REF_LONG ncell;
  REF_INT min_id, max_id, cell_id;
  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    fprintf(file, "title=\"tecplot refine gather\"\n");
    fprintf(file, "variables = \"x\" \"y\" \"z\"");
    if (NULL != scalar_names) {
      for (i = 0; i < ldim; i++) fprintf(file, " \"%s\"", scalar_names[i]);
    } else {
      for (i = 0; i < ldim; i++) fprintf(file, " \"V%d\"", i + 1);
    }
    fprintf(file, "\n");
  }

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  ref_cell = ref_grid_edg(ref_grid);
  RSS(ref_cell_id_range(ref_cell, ref_mpi, &min_id, &max_id), "range");

  for (cell_id = min_id; cell_id <= max_id; cell_id++) {
    RSS(ref_grid_compact_cell_id_nodes(ref_grid, ref_cell, cell_id, &nnode,
                                       &ncell, &l2c),
        "l2c");
    if (nnode > 0 && ncell > 0) {
      if (ref_grid_once(ref_grid)) {
        fprintf(file,
                "zone t=\"edg%d\", nodes=" REF_GLOB_FMT
                ", elements=%ld, datapacking=%s, "
                "zonetype=%s\n",
                cell_id, nnode, ncell, "point", "felineseg");
      }
      RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, ldim, scalar, file),
          "nodes");
      RSS(ref_gather_cell_id_tec(ref_node, ref_cell, cell_id, ncell, l2c,
                                 REF_FALSE, file),
          "t");
    }
    ref_free(l2c);
  }

  if (ref_grid_once(ref_grid)) fclose(file);

  return REF_SUCCESS;
}